

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_log2.hpp
# Opt level: O1

int boost::integer_log2<unsigned_long>(unsigned_long x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar2 = 0;
  if (x != 1) {
    if (x == 0) {
      __assert_fail("x > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/integer/integer_log2.hpp"
                    ,0x60,"int boost::integer_log2(T) [T = unsigned long]");
    }
    iVar2 = 0;
    iVar3 = 0x20;
    do {
      uVar4 = x >> ((byte)iVar3 & 0x3f);
      iVar1 = iVar3;
      if (uVar4 == 0) {
        uVar4 = x;
        iVar1 = 0;
      }
      iVar2 = iVar2 + iVar1;
      iVar3 = iVar3 / 2;
      x = uVar4;
    } while (uVar4 != 1);
  }
  return iVar2;
}

Assistant:

int integer_log2(T x) {

     assert(x > 0);

     const int n = detail::max_pow2_less<
                     detail::width<T> :: value, 4
                   > :: value;

     return detail::integer_log2_impl(x, n);

 }